

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O0

void __thiscall FGLRenderer::EndDrawScene(FGLRenderer *this,sector_t *viewsector)

{
  bool bVar1;
  AActor *pAVar2;
  bool renderHUDModel;
  sector_t *viewsector_local;
  FGLRenderer *this_local;
  
  FRenderState::EnableFog(&gl_RenderState,false);
  pAVar2 = TObjPtr<AActor>::operator->
                     ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
  bVar1 = gl_IsHUDModelForPlayerAvailable(pAVar2->player);
  if (bVar1) {
    (*_ptrc_glClear)(0x100);
    DrawPlayerSprites(this,viewsector,true);
  }
  (*_ptrc_glDisable)(0xb90);
  (**(code **)((long)(this->framebuffer->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.
                     super_DCanvas.super_DObject._vptr_DObject + 0x128))();
  Reset3DViewport(this);
  if (!bVar1) {
    DrawPlayerSprites(this,viewsector,false);
  }
  if ((gl.legacyMode & 1U) != 0) {
    FRenderState::DrawColormapOverlay(&gl_RenderState);
  }
  FRenderState::SetFixedColormap(&gl_RenderState,0);
  FRenderState::SetSoftLightLevel(&gl_RenderState,-1);
  DrawTargeterSprites(this);
  bVar1 = FGLRenderBuffers::IsEnabled();
  if (!bVar1) {
    DrawBlend(this,viewsector);
  }
  FRenderState::BlendFunc(&gl_RenderState,0x302,0x303);
  FRenderState::ResetColor(&gl_RenderState);
  FRenderState::EnableTexture(&gl_RenderState,true);
  (*_ptrc_glDisable)(0xc11);
  return;
}

Assistant:

void FGLRenderer::EndDrawScene(sector_t * viewsector)
{
	gl_RenderState.EnableFog(false);

	// [BB] HUD models need to be rendered here. Make sure that
	// DrawPlayerSprites is only called once. Either to draw
	// HUD models or to draw the weapon sprites.
	const bool renderHUDModel = gl_IsHUDModelForPlayerAvailable( players[consoleplayer].camera->player );
	if ( renderHUDModel )
	{
		// [BB] The HUD model should be drawn over everything else already drawn.
		glClear(GL_DEPTH_BUFFER_BIT);
		DrawPlayerSprites (viewsector, true);
	}

	glDisable(GL_STENCIL_TEST);

	framebuffer->Begin2D(false);

	Reset3DViewport();
	// [BB] Only draw the sprites if we didn't render a HUD model before.
	if ( renderHUDModel == false )
	{
		DrawPlayerSprites (viewsector, false);
	}
	if (gl.legacyMode)
	{
		gl_RenderState.DrawColormapOverlay();
	}

	gl_RenderState.SetFixedColormap(CM_DEFAULT);
	gl_RenderState.SetSoftLightLevel(-1);
	DrawTargeterSprites();
	if (!FGLRenderBuffers::IsEnabled())
	{
		DrawBlend(viewsector);
	}

	// Restore standard rendering state
	gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl_RenderState.ResetColor();
	gl_RenderState.EnableTexture(true);
	glDisable(GL_SCISSOR_TEST);
}